

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

Point __thiscall Board::find_king(Board *this,Color color)

{
  byte bVar1;
  dimension y;
  int iVar2;
  undefined7 in_register_00000031;
  dimension x;
  Point local_68;
  Point local_64;
  Point local_60;
  Point local_5c;
  int local_58;
  undefined4 local_54;
  long *local_50 [2];
  long local_40 [2];
  
  local_54 = (undefined4)CONCAT71(in_register_00000031,color);
  iVar2 = 0;
  do {
    x = 0;
    y = (dimension)iVar2;
    local_58 = iVar2;
    do {
      Point::Point(&local_5c,x,y);
      if (*(long *)(*(long *)&(this->m_board).m_data.
                              super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_5c.m_x].
                              super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                   + (long)local_5c.m_y * 0x10) != 0) {
        Point::Point(&local_60,x,y);
        (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                           super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_60.m_x].
                                           super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                + (long)local_60.m_y * 0x10) + 0x18))(local_50);
        iVar2 = std::__cxx11::string::compare((char *)local_50);
        if (iVar2 == 0) {
          Point::Point(&local_64,x,y);
          bVar1 = (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                                                                                          
                                                  super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_64.m_x].
                                                  super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                          + (long)local_64.m_y * 0x10) + 0x20))();
          bVar1 = bVar1 ^ (byte)local_54 ^ 1;
        }
        else {
          bVar1 = 0;
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if (bVar1 != 0) goto LAB_001074dc;
      }
      x = x + 1;
    } while (x != 8);
    iVar2 = local_58 + 1;
  } while ((short)iVar2 != 8);
  x = -1;
  y = -1;
LAB_001074dc:
  Point::Point(&local_68,x,y);
  return local_68;
}

Assistant:

Point Board::find_king(Color color) const {
    for (dimension i = 0; i < SIZE; i++) {
        for (dimension j = 0; j < SIZE; j++) {
            if ((m_board[{j, i}] != nullptr) && (m_board[{j, i}]->get_representation() == "Kg") &&
                (m_board[{j, i}]->get_color() == color)) {
                return Point(j, i);
            }
        }
    }

    return Point(-1, -1);
}